

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalized_cepstrum_gain_normalization.cc
# Opt level: O1

bool __thiscall
sptk::GeneralizedCepstrumGainNormalization::Run
          (GeneralizedCepstrumGainNormalization *this,
          vector<double,_std::allocator<double>_> *generalized_cepstrum,
          vector<double,_std::allocator<double>_> *normalized_generalized_cepstrum)

{
  double *pdVar1;
  double *pdVar2;
  pointer pdVar3;
  size_t __n;
  bool bVar4;
  size_type __new_size;
  pointer __src;
  double dVar5;
  double dVar6;
  
  if (this->is_valid_ == true) {
    bVar4 = false;
    if ((normalized_generalized_cepstrum != (vector<double,_std::allocator<double>_> *)0x0) &&
       (__new_size = (long)this->num_order_ + 1, bVar4 = false,
       (long)(generalized_cepstrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(generalized_cepstrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start >> 3 == __new_size)) {
      if ((long)(normalized_generalized_cepstrum->
                super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
                ._M_finish -
          (long)(normalized_generalized_cepstrum->
                super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
                ._M_start >> 3 != __new_size) {
        std::vector<double,_std::allocator<double>_>::resize
                  (normalized_generalized_cepstrum,__new_size);
      }
      dVar5 = this->gamma_;
      dVar6 = *(generalized_cepstrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((dVar5 != 0.0) || (NAN(dVar5))) {
        dVar6 = dVar6 * dVar5 + 1.0;
        dVar5 = pow(dVar6,1.0 / dVar5);
        pdVar3 = (normalized_generalized_cepstrum->
                 super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        *pdVar3 = dVar5;
        pdVar1 = (generalized_cepstrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        pdVar2 = (generalized_cepstrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                 .super__Vector_impl_data._M_finish;
        bVar4 = true;
        while (pdVar1 = pdVar1 + 1, pdVar1 != pdVar2) {
          pdVar3 = pdVar3 + 1;
          *pdVar3 = *pdVar1 / dVar6;
        }
      }
      else {
        dVar5 = exp(dVar6);
        pdVar3 = (normalized_generalized_cepstrum->
                 super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        *pdVar3 = dVar5;
        __src = (generalized_cepstrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start + 1;
        bVar4 = true;
        __n = (long)(generalized_cepstrum->super__Vector_base<double,_std::allocator<double>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)__src;
        if (__n != 0) {
          memmove(pdVar3 + 1,__src,__n);
        }
      }
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool GeneralizedCepstrumGainNormalization::Run(
    const std::vector<double>& generalized_cepstrum,
    std::vector<double>* normalized_generalized_cepstrum) const {
  // Check inputs.
  if (!is_valid_ ||
      generalized_cepstrum.size() != static_cast<std::size_t>(num_order_ + 1) ||
      NULL == normalized_generalized_cepstrum) {
    return false;
  }

  // Prepare memories.
  if (normalized_generalized_cepstrum->size() !=
      static_cast<std::size_t>(num_order_ + 1)) {
    normalized_generalized_cepstrum->resize(num_order_ + 1);
  }

  if (0.0 == gamma_) {
    (*normalized_generalized_cepstrum)[0] = std::exp(generalized_cepstrum[0]);
    std::copy(generalized_cepstrum.begin() + 1, generalized_cepstrum.end(),
              normalized_generalized_cepstrum->begin() + 1);
  } else {
    const double z(1.0 + gamma_ * generalized_cepstrum[0]);
    (*normalized_generalized_cepstrum)[0] = std::pow(z, 1.0 / gamma_);
    std::transform(generalized_cepstrum.begin() + 1, generalized_cepstrum.end(),
                   normalized_generalized_cepstrum->begin() + 1,
                   [z](double c) { return c / z; });
  }

  return true;
}